

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCooperativeVectorReduceSumNV
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  uint id;
  Op OVar1;
  Instruction *this_00;
  DiagnosticStream *pDVar2;
  undefined1 local_238 [4];
  spv_result_t error_1;
  DiagnosticStream local_218;
  Instruction *local_40;
  Instruction *v_type;
  spv_result_t local_30;
  uint32_t type_id;
  spv_result_t error;
  uint pointer_index;
  char *opcode_name;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _error = "spv::Op::OpCooperativeVectorReduceSumAccumulateNV";
  type_id = 0;
  opcode_name = (char *)inst;
  inst_local = (Instruction *)_;
  local_30 = ValidateCooperativeVectorPointer
                       (_,inst,"spv::Op::OpCooperativeVectorReduceSumAccumulateNV",0);
  this = inst_local;
  __local._4_4_ = local_30;
  if (local_30 == SPV_SUCCESS) {
    id = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)opcode_name,2);
    this_00 = ValidationState_t::FindDef((ValidationState_t *)this,id);
    v_type._4_4_ = val::Instruction::type_id(this_00);
    local_40 = ValidationState_t::FindDef((ValidationState_t *)inst_local,v_type._4_4_);
    OVar1 = val::Instruction::opcode(local_40);
    if (OVar1 == OpTypeCooperativeVectorNV) {
      __local._4_4_ =
           ValidateInt32Operand
                     ((ValidationState_t *)inst_local,(Instruction *)opcode_name,1,
                      "spv::Op::OpCooperativeVectorReduceSumAccumulateNV","Offset");
      if (__local._4_4_ == SPV_SUCCESS) {
        __local._4_4_ = SPV_SUCCESS;
      }
    }
    else {
      ValidationState_t::diag
                (&local_218,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)opcode_name);
      pDVar2 = DiagnosticStream::operator<<(&local_218,(char **)&error);
      pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [14])" V type <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)local_238,(ValidationState_t *)inst_local,v_type._4_4_);
      pDVar2 = DiagnosticStream::operator<<
                         (pDVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_238);
      pDVar2 = DiagnosticStream::operator<<
                         (pDVar2,(char (*) [35])" is not a cooperative vector type.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      std::__cxx11::string::~string((string *)local_238);
      DiagnosticStream::~DiagnosticStream(&local_218);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateCooperativeVectorReduceSumNV(ValidationState_t& _,
                                                  const Instruction* inst) {
  const auto opcode_name = "spv::Op::OpCooperativeVectorReduceSumAccumulateNV";
  const auto pointer_index = 0u;

  if (auto error = ValidateCooperativeVectorPointer(_, inst, opcode_name,
                                                    pointer_index)) {
    return error;
  }

  auto type_id = _.FindDef(inst->GetOperandAs<uint32_t>(2))->type_id();
  auto v_type = _.FindDef(type_id);

  if (v_type->opcode() != spv::Op::OpTypeCooperativeVectorNV) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << opcode_name << " V type <id> " << _.getIdName(type_id)
           << " is not a cooperative vector type.";
  }

  if (auto error = ValidateInt32Operand(_, inst, 1, opcode_name, "Offset")) {
    return error;
  }

  return SPV_SUCCESS;
}